

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void arm_cpu_initfn_aarch64(uc_struct_conflict2 *uc,CPUState *obj)

{
  TranslationBlock *pTVar1;
  
  obj[1].tb_jmp_cache[0xa42] = (TranslationBlock *)uc;
  obj->env_ptr = obj[1].tb_jmp_cache + 0x40b;
  obj->icount_decr_ptr = (IcountDecr *)(obj[1].tb_jmp_cache + 0x409);
  pTVar1 = (TranslationBlock *)
           g_hash_table_new_full(g_int_hash,g_int_equal,g_free,cpreg_hashtable_data_destroy);
  obj[1].tb_jmp_cache[0xa43] = pTVar1;
  obj[1].tb_jmp_cache[0xa85] = (TranslationBlock *)0x0;
  obj[1].tb_jmp_cache[0xa86] = (TranslationBlock *)0x0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa4c) = 2;
  return;
}

Assistant:

void arm_cpu_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    CPUARMState *env = &cpu->env;

    env->uc = uc;
    cpu_set_cpustate_pointers(cpu);
    cpu->cp_regs = g_hash_table_new_full(g_int_hash, g_int_equal,
                                         g_free, cpreg_hashtable_data_destroy);

    QLIST_INIT(&cpu->pre_el_change_hooks);
    QLIST_INIT(&cpu->el_change_hooks);

    /* DTB consumers generally don't in fact care what the 'compatible'
     * string is, so always provide some string and trust that a hypothetical
     * picky DTB consumer will also provide a helpful error message.
     */
    cpu->psci_version = 1; /* By default assume PSCI v0.1 */

    cpu->psci_version = 2; /* TCG implements PSCI 0.2 */
}